

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::TextureVkImpl::InitSparseProperties(TextureVkImpl *this)

{
  RESOURCE_DIMENSION RVar1;
  VulkanLogicalDevice *this_00;
  SPARSE_TEXTURE_FLAGS SVar2;
  uint uVar3;
  SparseTextureProperties *pSVar4;
  ulong uVar5;
  char (*pacVar6) [63];
  char *pcVar7;
  TextureFormatAttribs *pTVar8;
  char (*in_RCX) [29];
  char (*Args_1) [100];
  char (*Args_1_00) [63];
  char *pcVar9;
  SparseTextureProperties *pSVar10;
  string msg_2;
  uint32_t SparseReqCount;
  VkMemoryRequirements MemReq;
  VkSparseImageMemoryRequirements SparseReq [2];
  string local_c8;
  uint32_t local_a4;
  VkMemoryRequirements local_a0;
  undefined1 local_88 [32];
  Uint64 local_68;
  Uint64 UStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.Usage != USAGE_SPARSE) {
    FormatString<char[26],char[29]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Desc.Usage == USAGE_SPARSE",in_RCX);
    in_RCX = (char (*) [29])0x3cc;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_88._4_4_,local_88._0_4_),"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3cc);
    if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),local_88._16_8_ + 1);
    }
  }
  if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps._M_t.
      super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
      .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl ==
      (SparseTextureProperties *)0x0) {
    pSVar10 = (SparseTextureProperties *)0x0;
  }
  else {
    FormatString<char[26],char[26]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pSparseProps == nullptr",(char (*) [26])in_RCX);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_88._4_4_,local_88._0_4_),"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3cd);
    if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),local_88._16_8_ + 1);
    }
    pSVar10 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps._M_t.
              super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
              ._M_t.
              super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
              .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl;
  }
  pSVar4 = (SparseTextureProperties *)operator_new(0x38);
  pSVar4->FirstMipInTail = 0;
  pSVar4->TileSize[0] = 0;
  pSVar4->TileSize[1] = 0;
  pSVar4->TileSize[2] = 0;
  pSVar4->AddressSpaceSize = 0;
  pSVar4->MipTailOffset = 0;
  pSVar4->MipTailStride = 0;
  pSVar4->MipTailSize = 0;
  pSVar4->BlockSize = 0;
  pSVar4->Flags = SPARSE_TEXTURE_FLAG_NONE;
  *(undefined3 *)&pSVar4->field_0x35 = 0;
  pSVar4->FirstMipInTail = 0xffffffff;
  pSVar4->TileSize[0] = 0;
  pSVar4->TileSize[1] = 0;
  *(undefined8 *)(pSVar4->TileSize + 2) = 0;
  pSVar4->Flags = SPARSE_TEXTURE_FLAG_NONE;
  (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps._M_t.
  super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
  .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl = pSVar4;
  if (pSVar10 != (SparseTextureProperties *)0x0) {
    operator_delete(pSVar10,0x38);
  }
  this_00 = (((this->super_TextureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements
            (&local_a0,this_00,(this->m_VulkanImage).m_VkObject);
  local_a4 = 0;
  (*vkGetImageSparseMemoryRequirements)
            (this_00->m_VkDevice,(this->m_VulkanImage).m_VkObject,&local_a4,
             (VkSparseImageMemoryRequirements *)0x0);
  if (local_a4 != 1) {
    LogError<true,char[49]>
              (false,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3d8,(char (*) [49])"Sparse memory requirements for texture must be 1");
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  UStack_60 = 0;
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._0_4_ = 0;
  local_88._4_4_ = 0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  (*vkGetImageSparseMemoryRequirements)
            (this_00->m_VkDevice,(this->m_VulkanImage).m_VkObject,&local_a4,
             (VkSparseImageMemoryRequirements *)local_88);
  pSVar10 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps._M_t.
            super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
            .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl;
  pSVar10->MipTailSize = local_88._24_8_;
  pSVar10->MipTailOffset = local_68;
  pSVar10->MipTailStride = UStack_60;
  pSVar10->FirstMipInTail = local_88._20_4_;
  *(ulong *)pSVar10->TileSize = CONCAT44(local_88._8_4_,local_88._4_4_);
  pSVar10->TileSize[2] = local_88._12_4_;
  SVar2 = VkSparseImageFormatFlagsToSparseTextureFlags(local_88._16_4_);
  pSVar10->Flags = SVar2;
  RVar1 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Type;
  uVar3 = (uint)RVar1;
  if (((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) &&
     ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.field_3.ArraySize != 1)) {
    if ((SVar2 & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == SPARSE_TEXTURE_FLAG_NONE) {
      Args_1_00 = (char (*) [63])pSVar10->MipTailStride;
      if (Args_1_00 == (char (*) [63])0x0) {
        FormatString<char[26],char[24]>
                  (&local_c8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Props.MipTailStride > 0",(char (*) [24])0x0);
        DebugAssertionFailed
                  (local_c8._M_dataplus._M_p,"InitSparseProperties",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x3f3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        Args_1_00 = (char (*) [63])pSVar10->MipTailStride;
        uVar3 = (uint)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc.Type;
      }
    }
    else {
      pSVar10->MipTailStride = 0;
      Args_1_00 = (char (*) [63])0x0;
    }
    uVar5 = 1;
    if (((byte)uVar3 < 9) && ((0x1a8U >> (uVar3 & 0x1f) & 1) != 0)) {
      uVar5 = (ulong)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     .m_Desc.field_3.ArraySize;
    }
    if (uVar5 * (long)Args_1_00 - local_a0.size != 0) {
      FormatString<char[26],char[59]>
                (&local_c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailStride * m_Desc.GetArraySize() == MemReq.size",
                 (char (*) [59])Args_1_00);
      DebugAssertionFailed
                (local_c8._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      Args_1_00 = (char (*) [63])pSVar10->MipTailStride;
    }
    if ((ulong)Args_1_00 % local_a0.alignment != 0) {
      FormatString<char[26],char[44]>
                (&local_c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailStride % MemReq.alignment == 0",
                 (char (*) [44])Args_1_00);
      DebugAssertionFailed
                (local_c8._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      Args_1_00 = (char (*) [63])pSVar10->MipTailStride;
    }
    pacVar6 = (char (*) [63])pSVar10->MipTailOffset;
    if (Args_1_00 <= pacVar6) {
      FormatString<char[26],char[42]>
                (&local_c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset < Props.MipTailStride",(char (*) [42])Args_1_00
                );
      DebugAssertionFailed
                (local_c8._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      pacVar6 = (char (*) [63])pSVar10->MipTailOffset;
      Args_1_00 = (char (*) [63])pSVar10->MipTailStride;
    }
    if (Args_1_00 < (char (*) [63])((long)*pacVar6 + pSVar10->MipTailSize)) {
      FormatString<char[26],char[63]>
                (&local_c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset + Props.MipTailSize <= Props.MipTailStride",
                 Args_1_00);
      DebugAssertionFailed
                (local_c8._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pcVar7 = (char *)pSVar10->MipTailOffset;
    Args_1 = (char (*) [100])pSVar10->MipTailSize;
    pcVar9 = (char *)local_a0.size;
    if (local_a0.size <= pcVar7) {
      if ((char *)local_a0.size == pcVar7 && Args_1 == (char (*) [100])0x0) {
        Args_1 = (char (*) [100])0x0;
        pcVar9 = pcVar7;
      }
      else {
        FormatString<char[26],char[100]>
                  (&local_c8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "Props.MipTailOffset < MemReq.size || (Props.MipTailOffset == MemReq.size && Props.MipTailSize == 0)"
                   ,Args_1);
        DebugAssertionFailed
                  (local_c8._M_dataplus._M_p,"InitSparseProperties",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x3ea);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        pcVar7 = (char *)pSVar10->MipTailOffset;
        Args_1 = (char (*) [100])pSVar10->MipTailSize;
        pcVar9 = (char *)local_a0.size;
      }
    }
    if (pcVar9 < *Args_1 + (long)pcVar7) {
      FormatString<char[26],char[55]>
                (&local_c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset + Props.MipTailSize <= MemReq.size",
                 (char (*) [55])(*Args_1 + (long)pcVar7));
      DebugAssertionFailed
                (local_c8._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3eb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    pSVar10->MipTailStride = 0;
  }
  pSVar10->AddressSpaceSize = local_a0.size;
  uVar3 = StaticCast<unsigned_int,unsigned_long>(&local_a0.alignment);
  pSVar10->BlockSize = uVar3;
  pTVar8 = GetTextureFormatAttribs
                     ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  uVar3 = 1;
  if (pTVar8->ComponentType != COMPONENT_TYPE_COMPRESSED) {
    uVar3 = (uint)pTVar8->NumComponents;
  }
  if (uVar3 * pTVar8->ComponentSize * (pSVar10->TileSize[0] / (uint)pTVar8->BlockWidth) *
      (pSVar10->TileSize[1] / (uint)pTVar8->BlockHeight) * pSVar10->TileSize[2] *
      (this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.SampleCount != pSVar10->BlockSize) {
    FormatString<char[52]>
              (&local_c8,(char (*) [52])"Expected that memory alignment equals to block size");
    DebugAssertionFailed
              (local_c8._M_dataplus._M_p,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x406);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void TextureVkImpl::InitSparseProperties() noexcept(false)
{
    VERIFY_EXPR(m_Desc.Usage == USAGE_SPARSE);
    VERIFY_EXPR(m_pSparseProps == nullptr);

    m_pSparseProps = std::make_unique<SparseTextureProperties>();

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
    const VkMemoryRequirements                  MemReq        = LogicalDevice.GetImageMemoryRequirements(GetVkImage());

    // If the image was not created with VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT, then pSparseMemoryRequirementCount will be set to zero.
    uint32_t SparseReqCount = 0;
    vkGetImageSparseMemoryRequirements(LogicalDevice.GetVkDevice(), GetVkImage(), &SparseReqCount, nullptr);
    if (SparseReqCount != 1)
        LOG_ERROR_AND_THROW("Sparse memory requirements for texture must be 1");

    // Texture with depth-stencil format may be implemented with two memory blocks per tile.
    VkSparseImageMemoryRequirements SparseReq[2] = {};
    vkGetImageSparseMemoryRequirements(LogicalDevice.GetVkDevice(), GetVkImage(), &SparseReqCount, SparseReq);

    SparseTextureProperties& Props{*m_pSparseProps};
    Props.MipTailOffset  = SparseReq[0].imageMipTailOffset;
    Props.MipTailSize    = SparseReq[0].imageMipTailSize;
    Props.MipTailStride  = SparseReq[0].imageMipTailStride;
    Props.FirstMipInTail = SparseReq[0].imageMipTailFirstLod;
    Props.TileSize[0]    = SparseReq[0].formatProperties.imageGranularity.width;
    Props.TileSize[1]    = SparseReq[0].formatProperties.imageGranularity.height;
    Props.TileSize[2]    = SparseReq[0].formatProperties.imageGranularity.depth;
    Props.Flags          = VkSparseImageFormatFlagsToSparseTextureFlags(SparseReq[0].formatProperties.flags);

    if (m_Desc.GetArraySize() == 1)
    {
        VERIFY_EXPR(Props.MipTailOffset < MemReq.size || (Props.MipTailOffset == MemReq.size && Props.MipTailSize == 0));
        VERIFY_EXPR(Props.MipTailOffset + Props.MipTailSize <= MemReq.size);
        Props.MipTailStride = 0;
    }
    else
    {
        if (Props.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL)
            Props.MipTailStride = 0;
        else
            VERIFY_EXPR(Props.MipTailStride > 0);

        VERIFY_EXPR(Props.MipTailStride * m_Desc.GetArraySize() == MemReq.size);
        VERIFY_EXPR(Props.MipTailStride % MemReq.alignment == 0);
        VERIFY_EXPR(Props.MipTailOffset < Props.MipTailStride);
        VERIFY_EXPR(Props.MipTailOffset + Props.MipTailSize <= Props.MipTailStride);
    }

    Props.AddressSpaceSize = MemReq.size;
    Props.BlockSize        = StaticCast<Uint32>(MemReq.alignment);

#ifdef DILIGENT_DEBUG
    const TextureFormatAttribs& FmtAttribs    = GetTextureFormatAttribs(m_Desc.Format);
    const Uint32                BytesPerBlock = FmtAttribs.GetElementSize();
    const Uint32                BytesPerTile =
        (Props.TileSize[0] / FmtAttribs.BlockWidth) *
        (Props.TileSize[1] / FmtAttribs.BlockHeight) *
        Props.TileSize[2] * m_Desc.SampleCount * BytesPerBlock;

    VERIFY(BytesPerTile == Props.BlockSize, "Expected that memory alignment equals to block size");
#endif
}